

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

size_t __thiscall caffe::ScaleParameter::ByteSizeLong(ScaleParameter *this)

{
  void *pvVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  ulong uVar5;
  uint uVar6;
  size_t sVar7;
  
  pvVar1 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar1 & 1) == 0) {
    sVar7 = 0;
  }
  else {
    sVar7 = google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize
                      ((UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  uVar3 = (this->_has_bits_).has_bits_[0];
  if ((uVar3 & 0x1f) != 0) {
    if ((uVar3 & 1) != 0) {
      sVar4 = FillerParameter::ByteSizeLong(this->filler_);
      uVar3 = (uint)sVar4 | 1;
      iVar2 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar7 = sVar7 + sVar4 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 1;
    }
    if (((this->_has_bits_).has_bits_[0] & 2) != 0) {
      sVar4 = FillerParameter::ByteSizeLong(this->bias_filler_);
      uVar3 = (uint)sVar4 | 1;
      iVar2 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar7 = sVar7 + sVar4 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 1;
    }
    uVar3 = (this->_has_bits_).has_bits_[0];
    sVar7 = (uVar3 >> 1 & 2) + sVar7;
    if ((uVar3 & 8) != 0) {
      if (this->axis_ < 0) {
        uVar5 = 0xb;
      }
      else {
        uVar6 = this->axis_ | 1;
        iVar2 = 0x1f;
        if (uVar6 != 0) {
          for (; uVar6 >> iVar2 == 0; iVar2 = iVar2 + -1) {
          }
        }
        uVar5 = (ulong)((iVar2 * 9 + 0x49U >> 6) + 1);
      }
      sVar7 = sVar7 + uVar5;
    }
    if ((uVar3 & 0x10) != 0) {
      if (this->num_axes_ < 0) {
        uVar5 = 0xb;
      }
      else {
        uVar3 = this->num_axes_ | 1;
        iVar2 = 0x1f;
        if (uVar3 != 0) {
          for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
          }
        }
        uVar5 = (ulong)((iVar2 * 9 + 0x49U >> 6) + 1);
      }
      sVar7 = sVar7 + uVar5;
    }
  }
  this->_cached_size_ = (int)sVar7;
  return sVar7;
}

Assistant:

size_t ScaleParameter::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:caffe.ScaleParameter)
  size_t total_size = 0;

  if (_internal_metadata_.have_unknown_fields()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  if (_has_bits_[0 / 32] & 31u) {
    // optional .caffe.FillerParameter filler = 3;
    if (has_filler()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *this->filler_);
    }

    // optional .caffe.FillerParameter bias_filler = 5;
    if (has_bias_filler()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *this->bias_filler_);
    }

    // optional bool bias_term = 4 [default = false];
    if (has_bias_term()) {
      total_size += 1 + 1;
    }

    // optional int32 axis = 1 [default = 1];
    if (has_axis()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->axis());
    }

    // optional int32 num_axes = 2 [default = 1];
    if (has_num_axes()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->num_axes());
    }

  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}